

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O0

void highs::parallel::
     for_each<HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__1>
               (HighsInt start,HighsInt end,anon_class_32_4_8f8caa33 *f,HighsInt grainSize)

{
  int in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  int in_EDI;
  HighsInt split;
  TaskGroup tg;
  anon_class_24_4_3f80b2e7_for_functor *in_stack_ffffffffffffffa8;
  TaskGroup *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 uVar1;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_8;
  
  if (in_ECX < in_ESI - in_EDI) {
    TaskGroup::TaskGroup(in_stack_ffffffffffffffb0);
    local_8 = in_ESI;
    do {
      local_8 = in_EDI + local_8 >> 1;
      uVar1 = in_RDX;
      TaskGroup::
      spawn<highs::parallel::for_each<HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__1>(int,int,HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__1&&,int)::_lambda()_1_>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    } while (in_ECX < local_8 - in_EDI);
    HighsCliqueTable::queryNeighbourhood::anon_class_32_4_8f8caa33::operator()
              ((anon_class_32_4_8f8caa33 *)CONCAT44(local_8,in_stack_ffffffffffffffd0),
               (HighsInt)((ulong)uVar1 >> 0x20),(HighsInt)uVar1);
    TaskGroup::taskWait(in_stack_ffffffffffffffb0);
    TaskGroup::~TaskGroup(in_stack_ffffffffffffffb0);
  }
  else {
    HighsCliqueTable::queryNeighbourhood::anon_class_32_4_8f8caa33::operator()
              ((anon_class_32_4_8f8caa33 *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (HighsInt)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (HighsInt)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}